

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void update_stats(AV1_COMMON *cm,ThreadData_conflict *td)

{
  MACROBLOCKD *xd;
  PREDICTION_MODE mode;
  uint8_t uVar1;
  ushort uVar2;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *fc;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  FRAME_CONTEXT *pFVar5;
  int iVar6;
  BLOCK_SIZE sb_type;
  int8_t iVar7;
  MOTION_MODE MVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  RefCntBuffer *pRVar13;
  RefCntBuffer *pRVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  ulong uVar18;
  MV *pMVar19;
  byte bVar20;
  byte bVar21;
  MvSubpelPrecision precision;
  uint uVar22;
  undefined8 unaff_RBP;
  undefined7 uVar24;
  undefined8 uVar23;
  long lVar25;
  aom_cdf_prob (*cdf) [4];
  aom_cdf_prob (*paaVar26) [3];
  char cVar27;
  int ref;
  MV_REFERENCE_FRAME *pMVar28;
  int dir;
  OrderHintInfo *oh;
  uint uVar29;
  bool bVar30;
  int_mv dv_ref;
  undefined8 local_58;
  uint local_4c;
  undefined8 local_48;
  ulong local_40;
  MV_REFERENCE_FRAME *local_38;
  
  mbmi = *(td->mb).e_mbd.mi;
  uVar18 = (ulong)mbmi->bsize;
  bVar21 = (byte)*(undefined2 *)&mbmi->field_0xa7;
  if ((cm->seg).enabled == '\0') {
    bVar20 = 0;
    uVar24 = 0;
  }
  else {
    uVar16 = CONCAT71((int7)((ulong)unaff_RBP >> 8),(char)(cm->seg).feature_mask[bVar21 & 7]) &
             0xffffffffffffff20;
    uVar24 = (undefined7)(uVar16 >> 8);
    bVar20 = (byte)uVar16 >> 5;
  }
  fc = (td->mb).e_mbd.tile_ctx;
  if (((cm->current_frame).skip_mode_info.skip_mode_flag != 0) && (bVar20 == 0)) {
    bVar9 = block_size_high[uVar18];
    if (block_size_wide[uVar18] < block_size_high[uVar18]) {
      bVar9 = block_size_wide[uVar18];
    }
    if (7 < bVar9) {
      pMVar3 = (td->mb).e_mbd.left_mbmi;
      pMVar4 = (td->mb).e_mbd.above_mbmi;
      if (pMVar4 == (MB_MODE_INFO *)0x0) {
        uVar16 = 0;
      }
      else {
        uVar16 = (ulong)(*(ushort *)&pMVar4->field_0xa7 >> 6 & 1);
      }
      if (pMVar3 == (MB_MODE_INFO *)0x0) {
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)(*(ushort *)&pMVar3->field_0xa7 >> 6 & 1);
      }
      update_cdf(fc->skip_mode_cdfs[uVar15 + uVar16],bVar21 >> 6 & 1,2);
      bVar21 = (byte)*(undefined2 *)&mbmi->field_0xa7;
    }
  }
  if ((bVar21 >> 6 & 1) == 0 && bVar20 == 0) {
    pMVar3 = (td->mb).e_mbd.left_mbmi;
    pMVar4 = (td->mb).e_mbd.above_mbmi;
    if (pMVar4 == (MB_MODE_INFO *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (ulong)pMVar4->skip_txfm;
    }
    if (pMVar3 == (MB_MODE_INFO *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = (ulong)pMVar3->skip_txfm;
    }
    update_cdf(fc->skip_txfm_cdfs[uVar15 + uVar16],mbmi->skip_txfm,2);
    bVar21 = (byte)*(undefined2 *)&mbmi->field_0xa7;
  }
  xd = &(td->mb).e_mbd;
  if ((-1 < (char)bVar21) && (mbmi->ref_frame[0] < '\x01')) {
    av1_sum_intra_stats(cm,td->counts,xd,mbmi,(td->mb).e_mbd.above_mbmi,(td->mb).e_mbd.left_mbmi,
                        (uint)(((cm->current_frame).frame_type & 0xfd) == 0));
  }
  if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
       ((cm->features).allow_screen_content_tools == true)) &&
      ((cm->features).allow_intrabc != false)) &&
     (uVar2 = *(ushort *)&mbmi->field_0xa7 >> 7, update_cdf(fc->intrabc_cdf,(byte)uVar2 & 1,2),
     (uVar2 & 1) != 0)) {
    iVar7 = av1_ref_frame_type(mbmi->ref_frame);
    dv_ref = *(int_mv *)((td->mb).mbmi_ext.ref_mv_stack + iVar7);
    av1_update_mv_stats(&mbmi->mv[0].as_mv,&dv_ref.as_mv,&fc->ndvc,-1);
  }
  if (((cm->current_frame).frame_type & 0xfd) == 0) {
    return;
  }
  if ((*(ushort *)&mbmi->field_0xa7 & 0x40) != 0) {
    return;
  }
  if ((char)*(ushort *)&mbmi->field_0xa7 < '\0') {
    uVar29 = 1;
  }
  else {
    uVar29 = (uint)('\0' < mbmi->ref_frame[0]);
  }
  local_38 = (MV_REFERENCE_FRAME *)td->counts;
  if (bVar20 == 0) {
    iVar10 = av1_get_intra_inter_context(xd);
    update_cdf(fc->intra_inter_cdf[iVar10],(int8_t)uVar29,2);
    if (uVar29 == 0) {
      return;
    }
    uVar23 = CONCAT71(uVar24,mbmi->ref_frame[0]);
    bVar21 = mbmi->ref_frame[1];
    uVar17 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar21);
    local_4c = uVar29;
    if ((cm->current_frame).reference_mode == '\x02') {
      bVar20 = block_size_high[uVar18];
      if (block_size_wide[uVar18] < block_size_high[uVar18]) {
        bVar20 = block_size_wide[uVar18];
      }
      if (7 < bVar20) {
        pFVar5 = (td->mb).e_mbd.tile_ctx;
        local_48 = uVar23;
        iVar10 = av1_get_reference_mode_context(xd);
        uVar23 = local_48;
        update_cdf(pFVar5->comp_inter_cdf[iVar10],'\0' < mbmi->ref_frame[1],2);
        bVar21 = mbmi->ref_frame[1];
      }
    }
    cVar27 = (char)uVar23;
    if ((char)bVar21 < '\x01') {
      pFVar5 = (td->mb).e_mbd.tile_ctx;
      iVar10 = av1_get_pred_context_single_ref_p1(xd);
      update_cdf((aom_cdf_prob *)(pFVar5->single_ref_cdf + iVar10),'\x04' < cVar27,2);
      if (cVar27 < '\x05') {
        iVar10 = (int)uVar23 + -3;
        local_58 = CONCAT44(local_58._4_4_,iVar10);
        pFVar5 = (td->mb).e_mbd.tile_ctx;
        iVar11 = av1_get_pred_context_single_ref_p3(xd);
        update_cdf(pFVar5->single_ref_cdf[iVar11][2],(byte)iVar10 < 0xfe,2);
        pFVar5 = (td->mb).e_mbd.tile_ctx;
        if ((byte)local_58 < 0xfe) {
          iVar10 = av1_get_pred_context_single_ref_p5(xd);
          paaVar26 = pFVar5->single_ref_cdf[iVar10] + 4;
          bVar30 = cVar27 == '\x03';
        }
        else {
          iVar10 = av1_get_pred_context_single_ref_p4(xd);
          paaVar26 = pFVar5->single_ref_cdf[iVar10] + 3;
          bVar30 = cVar27 == '\x01';
        }
        bVar30 = !bVar30;
LAB_001d327a:
        update_cdf(*paaVar26,bVar30,2);
      }
      else {
        pFVar5 = (td->mb).e_mbd.tile_ctx;
        iVar10 = av1_get_pred_context_single_ref_p2(xd);
        update_cdf(pFVar5->single_ref_cdf[iVar10][1],cVar27 == '\a',2);
        if (cVar27 != '\a') {
          pFVar5 = (td->mb).e_mbd.tile_ctx;
          iVar10 = av1_get_pred_context_single_ref_p6(xd);
          paaVar26 = pFVar5->single_ref_cdf[iVar10] + 5;
          goto LAB_001d324a;
        }
      }
    }
    else {
      bVar30 = bVar21 < 5 == '\x04' < mbmi->ref_frame[0];
      local_58 = uVar17;
      local_40 = uVar18;
      iVar10 = av1_get_comp_reference_type_context(xd);
      update_cdf(((td->mb).e_mbd.tile_ctx)->comp_ref_type_cdf[iVar10],bVar30,2);
      if (bVar30) {
        local_48 = uVar23;
        iVar10 = av1_get_pred_context_comp_ref_p(xd);
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar10),
                   (byte)(cVar27 - 3U) < 2,2);
        if ((byte)(cVar27 - 3U) < 2) {
          bVar30 = (char)local_48 == '\x04';
          iVar10 = av1_get_pred_context_comp_ref_p2(xd);
          paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar10] + 2;
        }
        else {
          iVar10 = av1_get_pred_context_comp_ref_p1(xd);
          paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar10] + 1;
          bVar30 = (char)local_48 == '\x02';
        }
        uVar18 = local_40;
        update_cdf(*paaVar26,bVar30,2);
        iVar10 = av1_get_pred_context_comp_bwdref_p(xd);
        cVar27 = (char)local_58;
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar10),
                   cVar27 == '\a',2);
        if (cVar27 != '\a') {
          iVar10 = av1_get_pred_context_comp_bwdref_p1(xd);
          paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar10] + 1;
LAB_001d324a:
          bVar30 = cVar27 == '\x06';
          goto LAB_001d327a;
        }
      }
      else {
        iVar10 = av1_get_pred_context_uni_comp_ref_p(xd);
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar10),
                   cVar27 == '\x05',2);
        uVar18 = local_40;
        if (cVar27 != '\x05') {
          cVar27 = (char)local_58;
          bVar21 = cVar27 - 3;
          iVar10 = av1_get_pred_context_uni_comp_ref_p1(xd);
          update_cdf(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar10][1],bVar21 < 2,2);
          if (bVar21 < 2) {
            bVar30 = cVar27 == '\x04';
            iVar10 = av1_get_pred_context_uni_comp_ref_p2(xd);
            paaVar26 = ((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar10] + 2;
            goto LAB_001d327a;
          }
        }
      }
    }
    if (((cm->seq_params->enable_interintra_compound != '\0') &&
        (0xf8 < (byte)(mbmi->bsize - BLOCK_32X64))) &&
       ((0xfb < (byte)(mbmi->mode - 0x11) &&
        (('\0' < mbmi->ref_frame[0] && (mbmi->ref_frame[1] < '\x01')))))) {
      bVar21 = ""[uVar18];
      if (mbmi->ref_frame[1] == '\0') {
        update_cdf(fc->interintra_cdf[bVar21],'\x01',2);
        update_cdf(fc->interintra_mode_cdf[bVar21],mbmi->interintra_mode,4);
        if ((0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                         (ulong)(uint)((int)uVar18 << 5))) &&
           (update_cdf(fc->wedge_interintra_cdf[uVar18],
                       (byte)((ushort)*(undefined2 *)&mbmi->field_0xa7 >> 10) & 1,2),
           (mbmi->field_0xa8 & 4) != 0)) {
          update_cdf(fc->wedge_idx_cdf[uVar18],mbmi->interintra_wedge_index,0x10);
        }
      }
      else {
        update_cdf(fc->interintra_cdf[bVar21],'\0',2);
      }
    }
    MVar8 = '\0';
    if ((cm->features).switchable_motion_mode == true) {
      MVar8 = motion_mode_allowed((td->mb).e_mbd.global_motion,xd,mbmi,
                                  (uint)(cm->features).allow_warped_motion);
    }
    uVar29 = local_4c;
    cVar27 = mbmi->ref_frame[1];
    sb_type = (BLOCK_SIZE)uVar18;
    if (cVar27 != '\0') {
      if (MVar8 == '\x01') {
        cdf = (aom_cdf_prob (*) [4])(fc->obmc_cdf + uVar18);
        MVar8 = mbmi->motion_mode == '\x01';
        iVar10 = 2;
LAB_001d3367:
        update_cdf(*cdf,MVar8,iVar10);
        cVar27 = mbmi->ref_frame[1];
      }
      else if (MVar8 == '\x02') {
        cdf = fc->motion_mode_cdf + uVar18;
        MVar8 = mbmi->motion_mode;
        iVar10 = 3;
        goto LAB_001d3367;
      }
      if ('\0' < cVar27) {
        bVar21 = block_size_high[uVar18];
        if (block_size_wide[uVar18] < block_size_high[uVar18]) {
          bVar21 = block_size_wide[uVar18];
        }
        if (7 < bVar21) {
          for (uVar22 = 0; uVar22 != 4; uVar22 = uVar22 + 1) {
            if ((1 < uVar22) &&
               (iVar10 = is_interinter_compound_used((COMPOUND_TYPE)uVar22,sb_type), iVar10 != 0)) {
              if (cm->seq_params->enable_masked_compound != '\0') {
                pMVar3 = (td->mb).e_mbd.left_mbmi;
                pMVar4 = (td->mb).e_mbd.above_mbmi;
                uVar12 = 0;
                uVar22 = 0;
                if (pMVar4 != (MB_MODE_INFO *)0x0) {
                  if (pMVar4->ref_frame[1] < '\x01') {
                    uVar22 = (uint)(pMVar4->ref_frame[0] == '\a') * 3;
                  }
                  else {
                    uVar22 = *(ushort *)&pMVar4->field_0xa7 >> 8 & 1;
                  }
                }
                if (pMVar3 != (MB_MODE_INFO *)0x0) {
                  if (pMVar3->ref_frame[1] < '\x01') {
                    uVar12 = (uint)(pMVar3->ref_frame[0] == '\a') * 3;
                  }
                  else {
                    uVar12 = *(ushort *)&pMVar3->field_0xa7 >> 8 & 1;
                  }
                }
                uVar16 = 5;
                if (uVar12 + uVar22 < 5) {
                  uVar16 = (ulong)(uVar12 + uVar22);
                }
                update_cdf(fc->comp_group_idx_cdf[uVar16],mbmi->field_0xa8 & 1,2);
              }
              break;
            }
          }
        }
        if ((*(ushort *)&mbmi->field_0xa7 >> 8 & 1) == 0) {
          local_58 = CONCAT44(local_58._4_4_,(uint)*(ushort *)&mbmi->field_0xa7);
          pMVar3 = *(td->mb).e_mbd.mi;
          pRVar13 = get_ref_frame_buf(cm,pMVar3->ref_frame[0]);
          pRVar14 = get_ref_frame_buf(cm,pMVar3->ref_frame[1]);
          uVar22 = 0;
          uVar29 = 0;
          if (pRVar13 != (RefCntBuffer *)0x0) {
            uVar29 = pRVar13->order_hint;
          }
          uVar12 = cm->cur_frame->order_hint;
          if (pRVar14 != (RefCntBuffer *)0x0) {
            uVar22 = pRVar14->order_hint;
          }
          oh = &cm->seq_params->order_hint_info;
          iVar10 = get_relative_dist(oh,uVar22,uVar12);
          iVar11 = get_relative_dist(oh,uVar12,uVar29);
          pMVar3 = (td->mb).e_mbd.left_mbmi;
          pMVar4 = (td->mb).e_mbd.above_mbmi;
          if (pMVar4 == (MB_MODE_INFO *)0x0) {
            uVar16 = 0;
          }
          else if (pMVar4->ref_frame[1] < '\x01') {
            uVar16 = (ulong)(pMVar4->ref_frame[0] == '\a');
          }
          else {
            uVar16 = (ulong)(*(ushort *)&pMVar4->field_0xa7 >> 9 & 1);
          }
          if (pMVar3 == (MB_MODE_INFO *)0x0) {
            uVar15 = 0;
          }
          else if (pMVar3->ref_frame[1] < '\x01') {
            uVar15 = (ulong)(pMVar3->ref_frame[0] == '\a');
          }
          else {
            uVar15 = (ulong)(*(ushort *)&pMVar3->field_0xa7 >> 9 & 1);
          }
          iVar6 = -iVar10;
          if (0 < iVar10) {
            iVar6 = iVar10;
          }
          iVar10 = -iVar11;
          if (0 < iVar11) {
            iVar10 = iVar11;
          }
          paaVar26 = fc->compound_index_cdf + uVar16 + uVar15 + (ulong)(iVar6 == iVar10) * 3;
          bVar21 = (byte)((uint)local_58 >> 9) & 1;
          uVar29 = local_4c;
        }
        else {
          iVar10 = is_interinter_compound_used('\x02',sb_type);
          if (iVar10 == 0) goto LAB_001d35a6;
          paaVar26 = fc->compound_type_cdf + uVar18;
          bVar21 = (mbmi->interinter_comp).type - 2;
        }
        update_cdf(*paaVar26,bVar21,2);
      }
    }
LAB_001d35a6:
    if (((mbmi->interinter_comp).type == '\x02') &&
       (iVar10 = is_interinter_compound_used('\x02',sb_type), iVar10 != 0)) {
      update_cdf(fc->wedge_idx_cdf[uVar18],(mbmi->interinter_comp).wedge_index,0x10);
    }
  }
  if (uVar29 != 0) {
    if ((((cm->features).interp_filter == MULTITAP_SHARP2) &&
        (pMVar3 = *(td->mb).e_mbd.mi, (pMVar3->field_0xa7 & 0x40) == 0)) &&
       (pMVar3->motion_mode != '\x02')) {
      if ((pMVar3->mode == '\x17') || (pMVar3->mode == '\x0f')) {
        bVar21 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [pMVar3->bsize];
        if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
            [pMVar3->bsize] <
            "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
            [pMVar3->bsize]) {
          bVar21 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [pMVar3->bsize];
        }
        if (1 < bVar21) {
          lVar25 = 0;
          do {
            if ((ulong)('\0' < pMVar3->ref_frame[1]) + 1 == lVar25) goto LAB_001d3615;
            pMVar28 = pMVar3->ref_frame + lVar25;
            lVar25 = lVar25 + 1;
          } while ((td->mb).e_mbd.global_motion[*pMVar28].wmtype != '\x01');
        }
      }
      uVar1 = cm->seq_params->enable_dual_filter;
      for (iVar10 = 0; (iVar10 != 2 && (uVar1 != '\0' || iVar10 == 0)); iVar10 = iVar10 + 1) {
        iVar11 = av1_get_pred_context_switchable_interp(xd,iVar10);
        uVar29 = (mbmi->interp_filters).as_int >> 0x10;
        if (iVar10 == 0) {
          uVar29 = (mbmi->interp_filters).as_int;
        }
        update_cdf(((td->mb).e_mbd.tile_ctx)->switchable_interp_cdf[iVar11],(int8_t)uVar29,3);
      }
    }
LAB_001d3615:
    if (((cm->seg).enabled == '\0') ||
       (((cm->seg).feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) == 0)) {
      mode = mbmi->mode;
      pMVar28 = mbmi->ref_frame;
      iVar7 = av1_ref_frame_type(pMVar28);
      uVar2 = (td->mb).mbmi_ext.mode_context[iVar7];
      if (mbmi->ref_frame[1] < '\x01') {
        av1_update_inter_mode_stats(fc,(FRAME_COUNTS *)local_38,mode,uVar2);
      }
      else {
        uVar18 = (ulong)(uVar2 & 7);
        if (3 < (ushort)(uVar2 & 7)) {
          uVar18 = 4;
        }
        update_cdf(fc->inter_compound_mode_cdf[(short)compound_mode_ctx_map[uVar2 >> 5 & 7][uVar18]]
                   ,mode + 0xef,8);
      }
      bVar21 = mbmi->mode;
      bVar20 = bVar21 | 8;
      if ((bVar21 | 8) == 0x18) {
        local_38 = pMVar28;
        bVar21 = av1_ref_frame_type(pMVar28);
        uVar29 = 0;
        do {
          do {
            uVar22 = uVar29;
            if (uVar22 == 2) goto LAB_001d3770;
            uVar29 = uVar22 + 1;
          } while ((td->mb).mbmi_ext.ref_mv_count[bVar21] <= uVar29);
          bVar9 = av1_drl_ctx((td->mb).mbmi_ext.weight[bVar21],uVar22);
          update_cdf(fc->drl_cdf[bVar9],uVar22 != (*(ushort *)&mbmi->field_0xa7 >> 4 & 3),2);
        } while (uVar22 != (*(ushort *)&mbmi->field_0xa7 >> 4 & 3));
LAB_001d3770:
        bVar21 = mbmi->mode;
        pMVar28 = local_38;
      }
      if ((bVar21 < 0x17) && ((0x644000U >> (bVar21 & 0x1f) & 1) != 0)) {
        bVar21 = av1_ref_frame_type(pMVar28);
        uVar29 = 0;
        do {
          do {
            uVar22 = uVar29;
            if (uVar22 == 2) goto LAB_001d382b;
            uVar29 = uVar22 + 1;
          } while ((uint)(td->mb).mbmi_ext.ref_mv_count[bVar21] <= uVar22 + 2);
          bVar9 = av1_drl_ctx((td->mb).mbmi_ext.weight[bVar21],uVar29);
          update_cdf(fc->drl_cdf[bVar9],uVar22 != (*(ushort *)&mbmi->field_0xa7 >> 4 & 3),2);
        } while (uVar22 != (*(ushort *)&mbmi->field_0xa7 >> 4 & 3));
LAB_001d382b:
        bVar21 = mbmi->mode;
      }
      if ((bVar21 < 0x19) && ((0x1790000U >> (bVar21 & 0x1f) & 1) != 0)) {
        precision = -1;
        if ((cm->features).cur_frame_force_integer_mv == false) {
          precision = (cm->features).allow_high_precision_mv;
        }
        if (bVar20 == 0x18) {
          pMVar19 = (MV *)mbmi->mv;
          for (uVar18 = 0; uVar18 <= ('\0' < mbmi->ref_frame[1]); uVar18 = uVar18 + 1) {
            dv_ref = av1_get_ref_mv(&td->mb,(int)uVar18);
            av1_update_mv_stats(pMVar19,&dv_ref.as_mv,&fc->nmvc,precision);
            pMVar19 = pMVar19 + 1;
          }
        }
        else {
          switch((uint)bVar21) {
          case 0x13:
          case 0x15:
            dv_ref = av1_get_ref_mv(&td->mb,1);
            pMVar19 = (MV *)(mbmi->mv + 1);
            break;
          case 0x14:
          case 0x16:
            dv_ref = av1_get_ref_mv(&td->mb,0);
            pMVar19 = (MV *)mbmi->mv;
            break;
          default:
            goto switchD_001d38d8_default;
          }
          av1_update_mv_stats(pMVar19,&dv_ref.as_mv,&fc->nmvc,precision);
        }
      }
    }
  }
switchD_001d38d8_default:
  return;
}

Assistant:

static void update_stats(const AV1_COMMON *const cm, ThreadData *td) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const CurrentFrame *const current_frame = &cm->current_frame;
  const BLOCK_SIZE bsize = mbmi->bsize;
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const int seg_ref_active =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);

  if (current_frame->skip_mode_info.skip_mode_flag && !seg_ref_active &&
      is_comp_ref_allowed(bsize)) {
    const int skip_mode_ctx = av1_get_skip_mode_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_mode[skip_mode_ctx][mbmi->skip_mode]++;
#endif
    update_cdf(fc->skip_mode_cdfs[skip_mode_ctx], mbmi->skip_mode, 2);
  }

  if (!mbmi->skip_mode && !seg_ref_active) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_txfm[skip_ctx][mbmi->skip_txfm]++;
#endif
    update_cdf(fc->skip_txfm_cdfs[skip_ctx], mbmi->skip_txfm, 2);
  }

#if CONFIG_ENTROPY_STATS
  // delta quant applies to both intra and inter
  const int super_block_upper_left =
      ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
      ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  if (delta_q_info->delta_q_present_flag &&
      (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
      super_block_upper_left) {
    const int dq = (mbmi->current_qindex - xd->current_base_qindex) /
                   delta_q_info->delta_q_res;
    const int absdq = abs(dq);
    for (int i = 0; i < AOMMIN(absdq, DELTA_Q_SMALL); ++i) {
      td->counts->delta_q[i][1]++;
    }
    if (absdq < DELTA_Q_SMALL) td->counts->delta_q[absdq][0]++;
    if (delta_q_info->delta_lf_present_flag) {
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int delta_lf = (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                               delta_q_info->delta_lf_res;
          const int abs_delta_lf = abs(delta_lf);
          for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
            td->counts->delta_lf_multi[lf_id][i][1]++;
          }
          if (abs_delta_lf < DELTA_LF_SMALL)
            td->counts->delta_lf_multi[lf_id][abs_delta_lf][0]++;
        }
      } else {
        const int delta_lf =
            (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
            delta_q_info->delta_lf_res;
        const int abs_delta_lf = abs(delta_lf);
        for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
          td->counts->delta_lf[i][1]++;
        }
        if (abs_delta_lf < DELTA_LF_SMALL)
          td->counts->delta_lf[abs_delta_lf][0]++;
      }
    }
  }
#endif

  if (!is_inter_block(mbmi)) {
    av1_sum_intra_stats(cm, td->counts, xd, mbmi, xd->above_mbmi, xd->left_mbmi,
                        frame_is_intra_only(cm));
  }

  if (av1_allow_intrabc(cm)) {
    const int is_intrabc = is_intrabc_block(mbmi);
    update_cdf(fc->intrabc_cdf, is_intrabc, 2);
#if CONFIG_ENTROPY_STATS
    ++td->counts->intrabc[is_intrabc];
#endif  // CONFIG_ENTROPY_STATS
    if (is_intrabc) {
      const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      const int_mv dv_ref = mbmi_ext->ref_mv_stack[ref_frame_type][0].this_mv;
      av1_update_mv_stats(&mbmi->mv[0].as_mv, &dv_ref.as_mv, &fc->ndvc,
                          MV_SUBPEL_NONE);
    }
  }

  if (frame_is_intra_only(cm) || mbmi->skip_mode) return;

  FRAME_COUNTS *const counts = td->counts;
  const int inter_block = is_inter_block(mbmi);

  if (!seg_ref_active) {
#if CONFIG_ENTROPY_STATS
    counts->intra_inter[av1_get_intra_inter_context(xd)][inter_block]++;
#endif
    update_cdf(fc->intra_inter_cdf[av1_get_intra_inter_context(xd)],
               inter_block, 2);
    // If the segment reference feature is enabled we have only a single
    // reference frame allowed for the segment so exclude it from
    // the reference frame counts used to work out probabilities.
    if (inter_block) {
      const MV_REFERENCE_FRAME ref0 = mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME ref1 = mbmi->ref_frame[1];
      if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
        if (is_comp_ref_allowed(bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->comp_inter[av1_get_reference_mode_context(xd)]
                            [has_second_ref(mbmi)]++;
#endif  // CONFIG_ENTROPY_STATS
          update_cdf(av1_get_reference_mode_cdf(xd), has_second_ref(mbmi), 2);
        }
      }

      if (has_second_ref(mbmi)) {
        const COMP_REFERENCE_TYPE comp_ref_type = has_uni_comp_refs(mbmi)
                                                      ? UNIDIR_COMP_REFERENCE
                                                      : BIDIR_COMP_REFERENCE;
        update_cdf(av1_get_comp_reference_type_cdf(xd), comp_ref_type,
                   COMP_REFERENCE_TYPES);
#if CONFIG_ENTROPY_STATS
        counts->comp_ref_type[av1_get_comp_reference_type_context(xd)]
                             [comp_ref_type]++;
#endif  // CONFIG_ENTROPY_STATS

        if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
          const int bit = (ref0 == BWDREF_FRAME);
          update_cdf(av1_get_pred_cdf_uni_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts
              ->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            const int bit1 = (ref1 == LAST3_FRAME || ref1 == GOLDEN_FRAME);
            update_cdf(av1_get_pred_cdf_uni_comp_ref_p1(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
            counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p1(xd)][1]
                                [bit1]++;
#endif  // CONFIG_ENTROPY_STATS
            if (bit1) {
              update_cdf(av1_get_pred_cdf_uni_comp_ref_p2(xd),
                         ref1 == GOLDEN_FRAME, 2);
#if CONFIG_ENTROPY_STATS
              counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p2(xd)][2]
                                  [ref1 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
            }
          }
        } else {
          const int bit = (ref0 == GOLDEN_FRAME || ref0 == LAST3_FRAME);
          update_cdf(av1_get_pred_cdf_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts->comp_ref[av1_get_pred_context_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            update_cdf(av1_get_pred_cdf_comp_ref_p1(xd), ref0 == LAST2_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p1(xd)][1]
                            [ref0 == LAST2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_comp_ref_p2(xd), ref0 == GOLDEN_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p2(xd)][2]
                            [ref0 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
          update_cdf(av1_get_pred_cdf_comp_bwdref_p(xd), ref1 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p(xd)][0]
                             [ref1 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref1 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_comp_bwdref_p1(xd),
                       ref1 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p1(xd)][1]
                               [ref1 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      } else {
        const int bit = (ref0 >= BWDREF_FRAME);
        update_cdf(av1_get_pred_cdf_single_ref_p1(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
        counts->single_ref[av1_get_pred_context_single_ref_p1(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
        if (bit) {
          assert(ref0 <= ALTREF_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p2(xd), ref0 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p2(xd)][1]
                            [ref0 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref0 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_single_ref_p6(xd),
                       ref0 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p6(xd)][5]
                              [ref0 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        } else {
          const int bit1 = !(ref0 == LAST2_FRAME || ref0 == LAST_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p3(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p3(xd)][2][bit1]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit1) {
            update_cdf(av1_get_pred_cdf_single_ref_p4(xd), ref0 != LAST_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p4(xd)][3]
                              [ref0 != LAST_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_single_ref_p5(xd), ref0 != LAST3_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p5(xd)][4]
                              [ref0 != LAST3_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      }

      if (cm->seq_params->enable_interintra_compound &&
          is_interintra_allowed(mbmi)) {
        const int bsize_group = size_group_lookup[bsize];
        if (mbmi->ref_frame[1] == INTRA_FRAME) {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][1]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 1, 2);
#if CONFIG_ENTROPY_STATS
          counts->interintra_mode[bsize_group][mbmi->interintra_mode]++;
#endif
          update_cdf(fc->interintra_mode_cdf[bsize_group],
                     mbmi->interintra_mode, INTERINTRA_MODES);
          if (av1_is_wedge_used(bsize)) {
#if CONFIG_ENTROPY_STATS
            counts->wedge_interintra[bsize][mbmi->use_wedge_interintra]++;
#endif
            update_cdf(fc->wedge_interintra_cdf[bsize],
                       mbmi->use_wedge_interintra, 2);
            if (mbmi->use_wedge_interintra) {
#if CONFIG_ENTROPY_STATS
              counts->wedge_idx[bsize][mbmi->interintra_wedge_index]++;
#endif
              update_cdf(fc->wedge_idx_cdf[bsize], mbmi->interintra_wedge_index,
                         16);
            }
          }
        } else {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][0]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 0, 2);
        }
      }

      const MOTION_MODE motion_allowed =
          cm->features.switchable_motion_mode
              ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                    cm->features.allow_warped_motion)
              : SIMPLE_TRANSLATION;
      if (mbmi->ref_frame[1] != INTRA_FRAME) {
        if (motion_allowed == WARPED_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->motion_mode[bsize][mbmi->motion_mode]++;
#endif
          update_cdf(fc->motion_mode_cdf[bsize], mbmi->motion_mode,
                     MOTION_MODES);
        } else if (motion_allowed == OBMC_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->obmc[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
#endif
          update_cdf(fc->obmc_cdf[bsize], mbmi->motion_mode == OBMC_CAUSAL, 2);
        }
      }

      if (has_second_ref(mbmi)) {
        assert(current_frame->reference_mode != SINGLE_REFERENCE &&
               is_inter_compound_mode(mbmi->mode) &&
               mbmi->motion_mode == SIMPLE_TRANSLATION);

        const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                         cm->seq_params->enable_masked_compound;
        if (masked_compound_used) {
          const int comp_group_idx_ctx = get_comp_group_idx_context(xd);
#if CONFIG_ENTROPY_STATS
          ++counts->comp_group_idx[comp_group_idx_ctx][mbmi->comp_group_idx];
#endif
          update_cdf(fc->comp_group_idx_cdf[comp_group_idx_ctx],
                     mbmi->comp_group_idx, 2);
        }

        if (mbmi->comp_group_idx == 0) {
          const int comp_index_ctx = get_comp_index_context(cm, xd);
#if CONFIG_ENTROPY_STATS
          ++counts->compound_index[comp_index_ctx][mbmi->compound_idx];
#endif
          update_cdf(fc->compound_index_cdf[comp_index_ctx], mbmi->compound_idx,
                     2);
        } else {
          assert(masked_compound_used);
          if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
            ++counts->compound_type[bsize][mbmi->interinter_comp.type -
                                           COMPOUND_WEDGE];
#endif
            update_cdf(fc->compound_type_cdf[bsize],
                       mbmi->interinter_comp.type - COMPOUND_WEDGE,
                       MASKED_COMPOUND_TYPES);
          }
        }
      }
      if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
        if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->wedge_idx[bsize][mbmi->interinter_comp.wedge_index]++;
#endif
          update_cdf(fc->wedge_idx_cdf[bsize],
                     mbmi->interinter_comp.wedge_index, 16);
        }
      }
    }
  }

  if (inter_block && cm->features.interp_filter == SWITCHABLE &&
      av1_is_interp_needed(xd)) {
    update_filter_type_cdf(xd, mbmi, cm->seq_params->enable_dual_filter);
  }
  if (inter_block &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    const PREDICTION_MODE mode = mbmi->mode;
    const int16_t mode_ctx =
        av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);
    if (has_second_ref(mbmi)) {
#if CONFIG_ENTROPY_STATS
      ++counts->inter_compound_mode[mode_ctx][INTER_COMPOUND_OFFSET(mode)];
#endif
      update_cdf(fc->inter_compound_mode_cdf[mode_ctx],
                 INTER_COMPOUND_OFFSET(mode), INTER_COMPOUND_MODES);
    } else {
      av1_update_inter_mode_stats(fc, counts, mode, mode_ctx);
    }

    const int new_mv = mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV;
    if (new_mv) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 0; idx < 2; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx];
#endif
          if (mbmi->ref_mv_idx == idx) break;
        }
      }
    }

    if (have_nearmv_in_inter_mode(mbmi->mode)) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 1; idx < 3; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx - 1, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx - 1];
#endif
          if (mbmi->ref_mv_idx == idx - 1) break;
        }
      }
    }
    if (have_newmv_in_inter_mode(mbmi->mode)) {
      const int allow_hp = cm->features.cur_frame_force_integer_mv
                               ? MV_SUBPEL_NONE
                               : cm->features.allow_high_precision_mv;
      if (new_mv) {
        for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
          const int_mv ref_mv = av1_get_ref_mv(x, ref);
          av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                              allow_hp);
        }
      } else if (mbmi->mode == NEAREST_NEWMV || mbmi->mode == NEAR_NEWMV) {
        const int ref = 1;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      } else if (mbmi->mode == NEW_NEARESTMV || mbmi->mode == NEW_NEARMV) {
        const int ref = 0;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      }
    }
  }
}